

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool r_exec::match(IPGMContext *input,IPGMContext *pattern)

{
  IPGMContext *pIVar1;
  bool bVar2;
  uint16_t uVar3;
  Code *object;
  IPGMContext local_100;
  IPGMContext local_d0;
  uint16_t local_9e;
  uint16_t local_9c;
  ushort local_9a;
  undefined1 local_98 [2];
  uint16_t i;
  uint16_t unused_index;
  uint16_t guard_count;
  undefined1 local_68 [8];
  IPGMContext guard_set;
  Atom local_28 [6];
  uint16_t local_22;
  IPGMContext *pIStack_20;
  uint16_t ptr;
  IPGMContext *pattern_local;
  IPGMContext *input_local;
  
  pIStack_20 = pattern;
  pattern_local = input;
  bVar2 = IPGMContext::is_reference(input);
  pIVar1 = pIStack_20;
  if (bVar2) {
    object = IPGMContext::getObject(pattern_local);
    local_22 = IPGMContext::addProduction(pIVar1,object,false);
    pIVar1 = pIStack_20;
    uVar3 = IPGMContext::getIndex(pIStack_20);
    r_code::Atom::ProductionPointer((ushort)local_28);
    _Context::patch_code(&pIVar1->super__Context,uVar3 + 1,local_28);
    r_code::Atom::~Atom(local_28);
  }
  else {
    uVar3 = IPGMContext::getIndex(pIStack_20);
    IPGMContext::getIndex(pattern_local);
    r_code::Atom::IPointer((ushort)&guard_set.view);
    _Context::patch_code(&pIVar1->super__Context,uVar3 + 1,(Atom *)&guard_set.view);
    r_code::Atom::~Atom((Atom *)&guard_set.view);
  }
  IPGMContext::getChild((IPGMContext *)local_98,pIStack_20,2);
  IPGMContext::operator*((IPGMContext *)local_68,(IPGMContext *)local_98);
  IPGMContext::~IPGMContext((IPGMContext *)local_98);
  local_9a = IPGMContext::getChildrenCount((IPGMContext *)local_68);
  local_9e = 1;
  do {
    if (local_9a < local_9e) {
      input_local._7_1_ = 1;
LAB_00212f80:
      IPGMContext::~IPGMContext((IPGMContext *)local_68);
      return (bool)(input_local._7_1_ & 1);
    }
    IPGMContext::getChild(&local_100,(IPGMContext *)local_68,local_9e);
    IPGMContext::operator*(&local_d0,&local_100);
    bVar2 = IPGMContext::evaluate_no_dereference(&local_d0,&local_9c);
    IPGMContext::~IPGMContext(&local_d0);
    IPGMContext::~IPGMContext(&local_100);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      input_local._7_1_ = 0;
      goto LAB_00212f80;
    }
    local_9e = local_9e + 1;
  } while( true );
}

Assistant:

bool match(const IPGMContext &input, const IPGMContext &pattern)   // in red, patterns like (ptn object: [guards]) are allowed.
{
    // patch the pattern with a ptr to the input.
    if (input.is_reference()) {
        uint16_t ptr = pattern.addProduction(input.getObject(), false); // the object obviously is not new.
        pattern.patch_code(pattern.getIndex() + 1, Atom::ProductionPointer(ptr));
    } else {
        pattern.patch_code(pattern.getIndex() + 1, Atom::IPointer(input.getIndex()));
    }

    // evaluate the set of guards.
    IPGMContext guard_set = *pattern.getChild(2);
    uint16_t guard_count = guard_set.getChildrenCount();
    uint16_t unused_index;

    for (uint16_t i = 1; i <= guard_count; ++i) {
        if (!(*guard_set.getChild(i)).evaluate_no_dereference(unused_index)) { // WARNING: no check for duplicates.
            return false;
        }
    }

    return true;
}